

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O2

string * __thiscall wabt::Token::to_string_abi_cxx11_(string *__return_storage_ptr__,Token *this)

{
  TokenType TVar1;
  char *__s;
  allocator<char> *paVar2;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  TVar1 = this->token_type_;
  if ((ulong)TVar1 < 0x39) {
    __s = GetTokenTypeName::s_names[TVar1];
    paVar2 = &local_9;
  }
  else {
    if (TVar1 - First_Literal < 3) {
      __t = &(this->field_2).literal_.text;
      paVar2 = &local_a;
LAB_00162ddd:
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)__return_storage_ptr__,__t,paVar2);
      return __return_storage_ptr__;
    }
    if (TVar1 - AtomicFence < 0x47) {
      __s = Opcode::GetName(&(this->field_2).opcode_);
      paVar2 = &local_b;
    }
    else {
      if (TVar1 - AlignEqNat < 6) {
        __t = (basic_string_view<char,_std::char_traits<char>_> *)&this->field_2;
        paVar2 = &local_c;
        goto LAB_00162ddd;
      }
      if (2 < TVar1 - First_RefKind) {
        if (TVar1 - First_Type < 4) {
          Type::GetName_abi_cxx11_(__return_storage_ptr__,&(this->field_2).type_);
          return __return_storage_ptr__;
        }
        __assert_fail("HasType()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/token.cc"
                      ,0x55,"std::string wabt::Token::to_string() const");
      }
      __s = Type::GetRefKindName(&(this->field_2).type_);
      paVar2 = &local_d;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,paVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string Token::to_string() const {
  if (IsTokenTypeBare(token_type_)) {
    return GetTokenTypeName(token_type_);
  } else if (HasLiteral()) {
    return std::string(literal_.text);
  } else if (HasOpcode()) {
    return opcode_.GetName();
  } else if (HasText()) {
    return std::string(text_);
  } else if (IsTokenTypeRefKind(token_type_)) {
    return type_.GetRefKindName();
  } else {
    assert(HasType());
    return type_.GetName();
  }
}